

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_short(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,int16_t value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  int result;
  int16_t value_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  iVar1 = encode_short_constructor(encoder_output,context);
  if ((iVar1 == 0) && (iVar1 = encode_short_value(encoder_output,context,value), iVar1 == 0)) {
    return 0;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
              ,"encode_short",0xb67,1,"Failed encoding short");
  }
  return 0xb68;
}

Assistant:

static int encode_short(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, int16_t value)
{
    int result;

    if ((encode_short_constructor(encoder_output, context) != 0) ||
        (encode_short_value(encoder_output, context, value) != 0))
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        LogError("Failed encoding short");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
        result = 0;
    }

    return result;
}